

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  String *this_00;
  TestCase *pTVar1;
  bool bVar2;
  TestCase *pTVar3;
  reference ppTVar4;
  char *pcVar5;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar6;
  TestInfo *pTVar7;
  reference ppTVar8;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  bool local_cf;
  bool local_ce;
  bool local_cd;
  bool local_ca;
  Int32 local_98;
  Int32 local_94;
  undefined1 local_80 [4];
  bool is_selected;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  String test_name;
  TestInfo *test_info;
  size_t j;
  String local_50;
  String *local_40;
  String *test_case_name;
  TestCase *test_case;
  size_t i;
  int local_20;
  int num_selected_tests;
  int num_runnable_tests;
  Int32 shard_index;
  Int32 total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  
  shard_index = shard_tests;
  _total_shards = this;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_94 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
  }
  else {
    local_94 = -1;
  }
  num_runnable_tests = local_94;
  if (shard_index == 0) {
    local_98 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_98 = -1;
  }
  num_selected_tests = local_98;
  local_20 = 0;
  i._4_4_ = 0;
  test_case = (TestCase *)0x0;
  while( true ) {
    pTVar1 = test_case;
    pTVar3 = (TestCase *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                       (&this->test_cases_);
    if (pTVar3 <= pTVar1) break;
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    test_case_name = (String *)*ppTVar4;
    pcVar5 = TestCase::name((TestCase *)test_case_name);
    String::String(&local_50,pcVar5);
    local_40 = &local_50;
    TestCase::set_should_run((TestCase *)test_case_name,false);
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar6 = TestCase::test_info_list((TestCase *)test_case_name);
      pTVar7 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar6);
      if (pTVar7 <= test_info) break;
      pvVar6 = TestCase::test_info_list((TestCase *)test_case_name);
      ppTVar8 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar6,(size_type)test_info);
      test_name.length_ = (size_t)*ppTVar8;
      pcVar5 = TestInfo::name((TestInfo *)test_name.length_);
      String::String((String *)local_80,pcVar5);
      bVar2 = UnitTestOptions::MatchesFilter(local_40,"DISABLED_*:*/DISABLED_*");
      local_ca = true;
      if (!bVar2) {
        local_ca = UnitTestOptions::MatchesFilter((String *)local_80,"DISABLED_*:*/DISABLED_*");
      }
      *(bool *)(test_name.length_ + 0x59) = local_ca;
      bVar2 = UnitTestOptions::FilterMatchesTest(local_40,(String *)local_80);
      *(bool *)(test_name.length_ + 0x5a) = bVar2;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) || (local_cd = false, local_ca == false))
      {
        local_cd = bVar2;
      }
      local_ce = false;
      if (local_cd != false) {
        local_cf = true;
        if (shard_index != 1) {
          local_cf = ShouldRunTestOnShard(num_runnable_tests,num_selected_tests,local_20);
        }
        local_ce = local_cf;
      }
      this_00 = test_case_name;
      local_20 = local_20 + (uint)local_cd;
      i._4_4_ = i._4_4_ + (uint)local_ce;
      *(bool *)(test_name.length_ + 0x58) = local_ce;
      bVar2 = TestCase::should_run((TestCase *)test_case_name);
      in_stack_ffffffffffffff27 = true;
      if (!bVar2) {
        in_stack_ffffffffffffff27 = local_ce;
      }
      TestCase::set_should_run((TestCase *)this_00,(bool)in_stack_ffffffffffffff27);
      String::~String((String *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      test_info = (TestInfo *)&test_info->field_0x1;
    }
    String::~String((String *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1);
  }
  return i._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const String &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const String test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}